

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cldouble.c
# Opt level: O0

int mpt_cldouble(longdouble *val,char *src,longdouble *range)

{
  char cVar1;
  ushort **ppuVar2;
  longdouble in_ST0;
  longdouble *local_40;
  char *end;
  longdouble tmp;
  longdouble *range_local;
  char *src_local;
  longdouble *val_local;
  
  if (src == (char *)0x0) {
    val_local._4_4_ = -1;
  }
  else if (*src == '\0') {
    val_local._4_4_ = 0;
  }
  else {
    unique0x10000099 = range;
    range_local = (longdouble *)src;
    src_local = (char *)val;
    strtold(src,(char **)&local_40);
    if (local_40 == range_local) {
      do {
        if (*(char *)range_local == '\0') {
          return 0;
        }
        ppuVar2 = __ctype_b_loc();
        cVar1 = *(char *)range_local;
        range_local = (longdouble *)((long)range_local + 1);
      } while (((*ppuVar2)[(int)cVar1] & 0x2000) != 0);
      val_local._4_4_ = -3;
    }
    else if ((stack0xffffffffffffffd8 == (longdouble *)0x0) ||
            ((*stack0xffffffffffffffd8 <= in_ST0 && (in_ST0 <= stack0xffffffffffffffd8[1])))) {
      if (src_local != (char *)0x0) {
        *(longdouble *)src_local = in_ST0;
      }
      val_local._4_4_ = (int)local_40 - (int)range_local;
    }
    else {
      val_local._4_4_ = -2;
    }
  }
  return val_local._4_4_;
}

Assistant:

extern int mpt_cldouble(long double *val, const char *src, const long double range[2])
{
	long double tmp;
	char *end;
	
	if (!src) {
		return MPT_ERROR(BadArgument);
	}
	if (!*src) {
		return 0;
	}
	tmp = strtold(src, &end);
	
	if (end == src) {
		/* accept space as empty string */
		while (*src) {
			if (!isspace(*src++)) {
				return MPT_ERROR(BadType);
			}
		}
		return 0;
	}
	if (range && (range[0] > tmp || tmp > range[1])) {
		return MPT_ERROR(BadValue);
	}
	if (val) {
		*val = tmp;
	}
	return end - src;
}